

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_sockets.h
# Opt level: O2

int open_nb_socket(char *addr,char *port)

{
  addrinfo *paVar1;
  FILE *__stream;
  int iVar2;
  int __fd;
  uint uVar3;
  char *pcVar4;
  addrinfo **__pai;
  addrinfo *servinfo;
  addrinfo local_48;
  
  local_48.ai_flags = 0;
  local_48.ai_family = 0;
  local_48.ai_canonname = (char *)0x0;
  local_48.ai_next = (addrinfo *)0x0;
  local_48.ai_addrlen = 0;
  local_48._20_4_ = 0;
  local_48.ai_addr = (sockaddr *)0x0;
  local_48.ai_socktype = 1;
  local_48.ai_protocol = 0;
  __pai = (addrinfo **)&servinfo;
  iVar2 = getaddrinfo(addr,port,&local_48,__pai);
  __stream = _stderr;
  if (iVar2 == 0) {
    while (paVar1 = *__pai, __fd = -1, paVar1 != (addrinfo *)0x0) {
      __fd = socket(paVar1->ai_family,paVar1->ai_socktype,paVar1->ai_protocol);
      if (__fd != -1) {
        iVar2 = connect(__fd,paVar1->ai_addr,paVar1->ai_addrlen);
        if (iVar2 != -1) break;
        close(__fd);
      }
      __pai = &paVar1->ai_next;
    }
    freeaddrinfo((addrinfo *)servinfo);
    iVar2 = -1;
    if (__fd != -1) {
      uVar3 = fcntl(__fd,3);
      fcntl(__fd,4,(ulong)(uVar3 | 0x800));
      iVar2 = __fd;
    }
  }
  else {
    pcVar4 = gai_strerror(iVar2);
    fprintf(__stream,"Failed to open socket (getaddrinfo): %s\n",pcVar4);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int open_nb_socket(const char* addr, const char* port) {
    struct addrinfo hints = {0};

    hints.ai_family = AF_UNSPEC; /* IPv4 or IPv6 */
    hints.ai_socktype = SOCK_STREAM; /* Must be TCP */
    int sockfd = -1;
    int rv;
    struct addrinfo *p, *servinfo;

    /* get address information */
    rv = getaddrinfo(addr, port, &hints, &servinfo);
    if(rv != 0) {
        fprintf(stderr, "Failed to open socket (getaddrinfo): %s\n", gai_strerror(rv));
        return -1;
    }

    /* open the first possible socket */
    for(p = servinfo; p != NULL; p = p->ai_next) {
        sockfd = socket(p->ai_family, p->ai_socktype, p->ai_protocol);
        if (sockfd == -1) continue;

        /* connect to server */
        rv = connect(sockfd, p->ai_addr, p->ai_addrlen);
        if(rv == -1) {
          close(sockfd);
          sockfd = -1;
          continue;
        }
        break;
    }  

    /* free servinfo */
    freeaddrinfo(servinfo);

    /* make non-blocking */
#if !defined(WIN32)
    if (sockfd != -1) fcntl(sockfd, F_SETFL, fcntl(sockfd, F_GETFL) | O_NONBLOCK);
#else
    if (sockfd != INVALID_SOCKET) {
        int iMode = 1;
        ioctlsocket(sockfd, FIONBIO, &iMode);
    }
#endif
#if defined(__VMS)
    /* 
        OpenVMS only partially implements fcntl. It works on file descriptors
        but silently fails on socket descriptors. So we need to fall back on
        to the older ioctl system to set non-blocking IO
    */
    int on = 1;                 
    if (sockfd != -1) ioctl(sockfd, FIONBIO, &on);
#endif

    /* return the new socket fd */
    return sockfd;
}